

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RsWeightClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RsWeightClauseSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::syntax::RsProdSyntax*&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,RsProdSyntax **args_2)

{
  RsProdSyntax *pRVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  RsWeightClauseSyntax *pRVar7;
  
  pRVar7 = (RsWeightClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RsWeightClauseSyntax *)this->endPtr < pRVar7 + 1) {
    pRVar7 = (RsWeightClauseSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pRVar7 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pRVar1 = *args_2;
  (pRVar7->super_SyntaxNode).kind = RsWeightClause;
  (pRVar7->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pRVar7->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pRVar7->colonEqual).kind = TVar3;
  (pRVar7->colonEqual).field_0x2 = uVar4;
  (pRVar7->colonEqual).numFlags = (NumericTokenFlags)NVar5.raw;
  (pRVar7->colonEqual).rawLen = uVar6;
  (pRVar7->colonEqual).info = pIVar2;
  (pRVar7->weight).ptr = args_1;
  pRVar7->codeBlock = pRVar1;
  (args_1->super_SyntaxNode).parent = &pRVar7->super_SyntaxNode;
  if (pRVar1 != (RsProdSyntax *)0x0) {
    (pRVar1->super_SyntaxNode).parent = &pRVar7->super_SyntaxNode;
  }
  return pRVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }